

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

void __thiscall QUrlQuery::QUrlQuery(QUrlQuery *this,QUrl *url)

{
  long lVar1;
  undefined1 uVar2;
  QUrl *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff88;
  ComponentFormattingOption in_stack_ffffffffffffff8c;
  QSharedDataPointer<QUrlQueryPrivate> *in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffffb8;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffffbc;
  QUrlQueryPrivate *in_stack_ffffffffffffffc0;
  QFlagsStorage<QUrl::ComponentFormattingOption> in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSharedDataPointer<QUrlQueryPrivate>::QSharedDataPointer
            (in_stack_ffffffffffffff90,
             (QUrlQueryPrivate *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  uVar2 = QUrl::hasQuery((QUrl *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if ((bool)uVar2) {
    operator_new(0x28);
    uVar3 = 1;
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c);
    QUrl::query(in_RDI,(ComponentFormattingOptions)in_stack_ffffffffffffffec.i);
    QUrlQueryPrivate::QUrlQueryPrivate
              (in_stack_ffffffffffffffc0,
               (QString *)
               CONCAT44(in_stack_ffffffffffffffbc,
                        CONCAT13(uVar3,CONCAT12(uVar2,in_stack_ffffffffffffffb8))));
    QSharedDataPointer<QUrlQueryPrivate>::operator=
              (in_stack_ffffffffffffff90,
               (QUrlQueryPrivate *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QString::~QString((QString *)0x313bc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QUrlQuery::QUrlQuery(const QUrl &url)
    : d(nullptr)
{
    // use internals to avoid unnecessary recoding
    // ### FIXME: actually do it
    if (url.hasQuery())
        d = new QUrlQueryPrivate(url.query());
}